

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O3

base_learner * ftrl_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *pvVar2;
  size_t *psVar3;
  undefined8 uVar4;
  float *pfVar5;
  int iVar6;
  uint32_t uVar7;
  ftrl *pfVar8;
  option_group_definition *poVar9;
  ostream *poVar10;
  typed_option<unsigned_long> *ptVar11;
  size_t sVar12;
  learner<ftrl,_example> *plVar13;
  uint32_t *puVar14;
  code *predict;
  code *pcVar15;
  float *location;
  float fVar16;
  bool coin;
  bool pistol;
  bool ftrl_option;
  string algorithm_name;
  option_group_definition new_options;
  bool local_513;
  bool local_512;
  bool local_511;
  options_i *local_510;
  ftrl *local_508;
  free_ptr<ftrl> local_500;
  float *local_4f0;
  undefined1 local_4e8 [112];
  bool local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  string local_448;
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  string local_408;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  string local_3c8;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  string local_388;
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  option_group_definition local_348;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  string local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_510 = options;
  pfVar8 = calloc_or_throw<ftrl>(1);
  pfVar8->all = (vw *)0x0;
  pfVar8->ftrl_alpha = 0.0;
  pfVar8->ftrl_beta = 0.0;
  (pfVar8->data).update = 0.0;
  (pfVar8->data).ftrl_alpha = 0.0;
  (pfVar8->data).ftrl_beta = 0.0;
  (pfVar8->data).l1_lambda = 0.0;
  (pfVar8->data).l2_lambda = 0.0;
  (pfVar8->data).predict = 0.0;
  *(undefined8 *)&(pfVar8->data).normalized_squared_norm_x = 0;
  pfVar8->no_win_counter = 0;
  pfVar8->early_stop_thres = 0;
  pfVar8->total_weight = 0.0;
  local_500._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<ftrl>;
  local_511 = false;
  local_512 = false;
  local_513 = false;
  local_508 = pfVar8;
  local_500._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>._M_head_impl
       = pfVar8;
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"Follow the Regularized Leader","");
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_368,local_368 + local_360);
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ftrl","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4e8,&local_388,&local_511);
  local_478 = true;
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,"FTRL: Follow the Proximal Regularized Leader","");
  std::__cxx11::string::_M_assign((string *)(local_4e8 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_348,(typed_option<bool> *)local_4e8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"coin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_3c8,&local_513);
  local_240 = true;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Coin betting optimizer","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_2b0);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"pistol","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_408,&local_512);
  local_1a0 = true;
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,"PiSTOL: Parameter-free STOchastic Learning","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_210);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ftrl_alpha","");
  local_4f0 = &pfVar8->ftrl_alpha;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_448,local_4f0);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,(typed_option<float> *)local_d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ftrl_beta","");
  location = &pfVar8->ftrl_beta;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_170,&local_2f0,location);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (poVar9,(typed_option<float> *)local_170);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0]);
  }
  pfVar8 = local_508;
  local_170._0_8_ = &PTR__typed_option_002d7e20;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002d7e20;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  pfVar5 = local_4f0;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002d5f10;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d5f10;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0]);
  }
  local_4e8._0_8_ = &PTR__typed_option_002d5f10;
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  (**local_510->_vptr_options_i)();
  if (local_511 == false) {
    if (local_512 != false) {
      pp_Var1 = (_func_int **)(local_4e8 + 0x10);
      local_4e8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
      iVar6 = (*local_510->_vptr_options_i[1])(local_510,local_4e8);
      if ((char)iVar6 == '\0') {
        fVar16 = 1.0;
      }
      else {
        fVar16 = *pfVar5;
      }
      *pfVar5 = fVar16;
      if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
        operator_delete((void *)local_4e8._0_8_);
      }
      local_4e8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
      iVar6 = (*local_510->_vptr_options_i[1])();
      if ((char)iVar6 != '\0') goto LAB_001ffd11;
      fVar16 = 0.5;
      goto LAB_001ffd21;
    }
    if (local_513 == false) {
      plVar13 = (learner<ftrl,_example> *)0x0;
      goto LAB_0020014c;
    }
    if (local_513 == true) {
      pp_Var1 = (_func_int **)(local_4e8 + 0x10);
      local_4e8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
      iVar6 = (*local_510->_vptr_options_i[1])(local_510,local_4e8);
      if ((char)iVar6 == '\0') {
        fVar16 = 4.0;
      }
      else {
        fVar16 = *pfVar5;
      }
      *pfVar5 = fVar16;
      if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
        operator_delete((void *)local_4e8._0_8_);
      }
      local_4e8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
      iVar6 = (*local_510->_vptr_options_i[1])();
      if ((char)iVar6 != '\0') goto LAB_001ffd11;
      fVar16 = 1.0;
      goto LAB_001ffd21;
    }
  }
  else {
    pp_Var1 = (_func_int **)(local_4e8 + 0x10);
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
    iVar6 = (*local_510->_vptr_options_i[1])(local_510,local_4e8);
    if ((char)iVar6 == '\0') {
      fVar16 = 0.005;
    }
    else {
      fVar16 = *pfVar5;
    }
    *pfVar5 = fVar16;
    if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4e8._0_8_);
    }
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
    iVar6 = (*local_510->_vptr_options_i[1])();
    if ((char)iVar6 == '\0') {
      fVar16 = 0.1;
    }
    else {
LAB_001ffd11:
      fVar16 = *location;
    }
LAB_001ffd21:
    *location = fVar16;
    if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_);
    }
  }
  pfVar8->all = all;
  pfVar8->no_win_counter = 0;
  all->normalized_sum_norm_x = 0.0;
  pfVar8->total_weight = 0.0;
  pp_Var1 = (_func_int **)(local_4e8 + 0x10);
  local_4e8._8_8_ = (pointer)0x0;
  local_4e8[0x10] = 0;
  local_4e8._0_8_ = pp_Var1;
  if (local_511 == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x284b07);
    pcVar15 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar15 = learn_proximal<true>;
    }
    uVar7 = 2;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
    }
    else {
LAB_001ffe66:
      (all->weights).dense_weights._stride_shift = uVar7;
    }
  }
  else if (local_512 == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x284b15);
    if ((all->weights).sparse != true) {
      pcVar15 = learn_pistol;
      uVar7 = 2;
      goto LAB_001ffe66;
    }
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
    pcVar15 = learn_pistol;
  }
  else if (local_513 == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x284b1c);
    if ((all->weights).sparse != true) {
      pcVar15 = learn_cb;
      uVar7 = 3;
      goto LAB_001ffe66;
    }
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,3);
    pcVar15 = learn_cb;
  }
  else {
    pcVar15 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar16 = pfVar8->ftrl_beta;
  (pfVar8->data).ftrl_alpha = pfVar8->ftrl_alpha;
  (pfVar8->data).ftrl_beta = fVar16;
  pvVar2 = pfVar8->all;
  (pfVar8->data).l1_lambda = pvVar2->l1_lambda;
  (pfVar8->data).l2_lambda = pvVar2->l2_lambda;
  if (all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Enabling FTRL based optimization",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Algorithm used: ",0x10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_4e8._0_8_,local_4e8._8_8_);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_alpha = ",0xd);
    poVar10 = std::ostream::_M_insert<double>((double)*local_4f0);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_beta = ",0xc);
    poVar10 = std::ostream::_M_insert<double>((double)*location);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"early_terminate","");
    ptVar11 = VW::config::options_i::get_typed_option<unsigned_long>(local_510,(string *)local_2b0);
    psVar3 = (ptVar11->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar3 == (size_t *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = *psVar3;
    }
    pfVar8->early_stop_thres = sVar12;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar14 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar14 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar13 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                      (&local_500,pcVar15,predict,1L << ((byte)*puVar14 & 0x3f));
  uVar4 = *(undefined8 *)(plVar13 + 0x18);
  *(undefined8 *)(plVar13 + 0x48) = uVar4;
  *(code **)(plVar13 + 0x50) = sensitivity;
  pcVar15 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar15 = multipredict<true>;
  }
  *(code **)(plVar13 + 0x40) = pcVar15;
  *(code **)(plVar13 + 0x80) = save_load;
  *(undefined8 *)(plVar13 + 0x70) = uVar4;
  *(undefined8 *)(plVar13 + 0x78) = *(undefined8 *)(plVar13 + 0x20);
  *(undefined8 *)(plVar13 + 0x88) = uVar4;
  *(undefined8 *)(plVar13 + 0x90) = *(undefined8 *)(plVar13 + 0x20);
  *(code **)(plVar13 + 0x98) = end_pass;
  if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_4e8._0_8_);
  }
LAB_0020014c:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (local_500._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl != (ftrl *)0x0) {
    (*(code *)local_500._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_500._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar13;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;
  bool coin = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("coin", coin).keep().help("Coin betting optimizer"))
      .add(make_option("pistol", pistol).keep().help("PiSTOL: Parameter-free STOchastic Learning"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol && !coin)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }
  else if (coin)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 4.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 1.0f;
  }


  b->all = &all;
  b->no_win_counter = 0;
  b->all->normalized_sum_norm_x = 0;
  b->total_weight = 0.;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
      all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
    all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (coin)
  {
    algorithm_name = "Coin Betting";
    learn_ptr = learn_cb;
    all.weights.stride_shift(3);  // NOTE: for more parameter storage
  }

  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}